

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv.cc
# Opt level: O0

btree_kv_ops * btree_kv_get_kbn_vb64(btree_kv_ops *kv_ops)

{
  btree_kv_ops *in_RDI;
  btree_kv_ops *btree_kv_ops;
  btree_kv_ops *local_10;
  
  local_10 = in_RDI;
  if (in_RDI == (btree_kv_ops *)0x0) {
    local_10 = (btree_kv_ops *)malloc(0x78);
  }
  local_10->get_kv = _get_kv;
  local_10->set_kv = _set_kv;
  local_10->ins_kv = _ins_kv;
  local_10->copy_kv = _copy_kv;
  local_10->set_key = _set_key;
  local_10->set_value = _set_value;
  local_10->get_data_size = _get_data_size;
  local_10->get_kv_size = _get_kv_size;
  local_10->init_kv_var = _init_kv_var;
  local_10->free_kv_var = (btree_print_func *)0x0;
  local_10->get_nth_idx = _get_nth_idx;
  local_10->get_nth_splitter = _get_nth_splitter;
  local_10->cmp = _cmp_binary_general;
  local_10->bid2value = _bid_to_value_64;
  local_10->value2bid = _value_to_bid_64;
  return local_10;
}

Assistant:

struct btree_kv_ops * btree_kv_get_kbn_vb64(struct btree_kv_ops *kv_ops)
{
    struct btree_kv_ops *btree_kv_ops;
    if (kv_ops) {
        btree_kv_ops = kv_ops;
    }else{
        btree_kv_ops = (struct btree_kv_ops *)malloc(sizeof(struct btree_kv_ops));
    }

    btree_kv_ops->get_kv = _get_kv;
    btree_kv_ops->set_kv = _set_kv;
    btree_kv_ops->ins_kv = _ins_kv;
    btree_kv_ops->copy_kv = _copy_kv;
    btree_kv_ops->set_key = _set_key;
    btree_kv_ops->set_value = _set_value;
    btree_kv_ops->get_data_size = _get_data_size;
    btree_kv_ops->get_kv_size = _get_kv_size;
    btree_kv_ops->init_kv_var = _init_kv_var;
    btree_kv_ops->free_kv_var = NULL;

    btree_kv_ops->get_nth_idx = _get_nth_idx;
    btree_kv_ops->get_nth_splitter = _get_nth_splitter;

    btree_kv_ops->cmp = _cmp_binary_general;

    btree_kv_ops->bid2value = _bid_to_value_64;
    btree_kv_ops->value2bid = _value_to_bid_64;

    return btree_kv_ops;
}